

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O3

void __thiscall
pbrt::PiecewiseConstant2D::PiecewiseConstant2D
          (PiecewiseConstant2D *this,span<const_float> func,int nx,int ny,Bounds2f domain,
          Allocator alloc)

{
  size_t n;
  float *pfVar1;
  ulong uVar2;
  float *pfVar3;
  float *pfVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  span<const_float> f;
  vector<float,_std::allocator<float>_> marginalFunc;
  Allocator alloc_local;
  Bounds2f domain_local;
  size_t va;
  float *local_78;
  size_t local_70;
  size_t local_68;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_60;
  Float local_40;
  Float FStack_3c;
  Float local_38;
  
  auVar8._8_56_ = domain._16_56_;
  auVar8._0_8_ = domain.pMax.super_Tuple2<pbrt::Point2,_float>;
  auVar7._8_56_ = domain._8_56_;
  auVar7._0_8_ = domain.pMin.super_Tuple2<pbrt::Point2,_float>;
  pfVar1 = (float *)func.n;
  pfVar4 = func.ptr;
  domain_local = (Bounds2f)vmovlhps_avx(auVar7._0_16_,auVar8._0_16_);
  pfVar3 = (float *)(long)nx;
  n = (size_t)ny;
  marginalFunc.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)(n * (long)pfVar3);
  (this->domain).pMin.super_Tuple2<pbrt::Point2,_float> =
       domain_local.pMin.super_Tuple2<pbrt::Point2,_float>;
  (this->domain).pMax.super_Tuple2<pbrt::Point2,_float> =
       domain_local.pMax.super_Tuple2<pbrt::Point2,_float>;
  auVar6 = ZEXT816(0) << 0x20;
  (this->pConditionalY).alloc.memoryResource = alloc.memoryResource;
  (this->pConditionalY).nStored = 0;
  (this->pConditionalY).ptr = (PiecewiseConstant1D *)auVar6._0_8_;
  (this->pConditionalY).nAlloc = auVar6._8_8_;
  (this->pMarginal).func.alloc.memoryResource = alloc.memoryResource;
  (this->pMarginal).func.nStored = 0;
  (this->pMarginal).func.ptr = (float *)auVar6._0_8_;
  (this->pMarginal).func.nAlloc = auVar6._8_8_;
  (this->pMarginal).cdf.alloc.memoryResource = alloc.memoryResource;
  (this->pMarginal).cdf.nStored = 0;
  (this->pMarginal).cdf.ptr = (float *)auVar6._0_8_;
  (this->pMarginal).cdf.nAlloc = auVar6._8_8_;
  (this->pMarginal).funcInt = 0.0;
  alloc_local = alloc;
  va = (size_t)pfVar1;
  if ((long)marginalFunc.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start - (long)pfVar1 == 0) {
    pstd::
    vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
    ::reserve(&this->pConditionalY,n);
    if (0 < ny) {
      uVar2 = (ulong)(uint)ny;
      do {
        local_78 = pfVar1;
        if (pfVar3 <= pfVar1) {
          local_78 = pfVar3;
        }
        va = (size_t)pfVar4;
        pstd::
        vector<pbrt::PiecewiseConstant1D,pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>>
        ::
        emplace_back<pstd::span<float_const>,float&,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
                  ((vector<pbrt::PiecewiseConstant1D,pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>>
                    *)&this->pConditionalY,(span<const_float> *)&va,(float *)&domain_local,
                   (float *)&domain_local.pMax,&alloc_local);
        pfVar4 = pfVar4 + (long)pfVar3;
        uVar2 = uVar2 - 1;
        pfVar1 = (float *)((long)pfVar1 - (long)pfVar3);
      } while (uVar2 != 0);
    }
    marginalFunc.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    marginalFunc.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    marginalFunc.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    std::vector<float,_std::allocator<float>_>::reserve(&marginalFunc,n);
    if (0 < ny) {
      lVar5 = 0;
      do {
        pfVar1 = (float *)((long)&((this->pConditionalY).ptr)->funcInt + lVar5);
        if (marginalFunc.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            marginalFunc.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                    ((vector<float,std::allocator<float>> *)&marginalFunc,
                     (iterator)
                     marginalFunc.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish,pfVar1);
        }
        else {
          *marginalFunc.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish = *pfVar1;
          marginalFunc.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish =
               marginalFunc.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        lVar5 = lVar5 + 0x50;
      } while ((ulong)(uint)ny * 0x50 != lVar5);
    }
    f.n = (long)marginalFunc.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)marginalFunc.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start >> 2;
    f.ptr = marginalFunc.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
    PiecewiseConstant1D::PiecewiseConstant1D
              ((PiecewiseConstant1D *)&va,f,domain_local.pMin.super_Tuple2<pbrt::Point2,_float>.y,
               domain_local.pMax.super_Tuple2<pbrt::Point2,_float>.y,alloc_local);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
              (&(this->pMarginal).func,
               (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)&va);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
              (&(this->pMarginal).cdf,&local_60);
    (this->pMarginal).funcInt = local_38;
    (this->pMarginal).min = local_40;
    (this->pMarginal).max = FStack_3c;
    local_60.nStored = 0;
    (*(local_60.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_60.alloc.memoryResource,local_60.ptr,local_60.nAlloc << 2,4);
    local_68 = 0;
    (**(code **)(*(long *)va + 0x18))(va,local_78,local_70 << 2,4);
    if (marginalFunc.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(marginalFunc.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)marginalFunc.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)marginalFunc.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return;
  }
  LogFatal<char_const(&)[12],char_const(&)[24],char_const(&)[12],unsigned_long&,char_const(&)[24],unsigned_long&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling.h"
             ,0x328,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [12])0x50723c,
             (char (*) [24])"(size_t)nx * (size_t)ny",(char (*) [12])0x50723c,&va,
             (char (*) [24])"(size_t)nx * (size_t)ny",(unsigned_long *)&marginalFunc);
}

Assistant:

PiecewiseConstant2D(pstd::span<const Float> func, int nx, int ny, Bounds2f domain,
                        Allocator alloc = {})
        : domain(domain), pConditionalY(alloc), pMarginal(alloc) {
        CHECK_EQ(func.size(), (size_t)nx * (size_t)ny);
        pConditionalY.reserve(ny);
        for (int y = 0; y < ny; ++y)
            // Compute conditional sampling distribution for $\tilde{y}$
            // TODO: emplace_back is key so the alloc sticks. WHY?
            pConditionalY.emplace_back(func.subspan(y * nx, nx), domain.pMin[0],
                                       domain.pMax[0], alloc);

        // Compute marginal sampling distribution $p[\tilde{y}]$
        std::vector<Float> marginalFunc;
        marginalFunc.reserve(ny);
        for (int y = 0; y < ny; ++y)
            marginalFunc.push_back(pConditionalY[y].funcInt);
        pMarginal =
            PiecewiseConstant1D(marginalFunc, domain.pMin[1], domain.pMax[1], alloc);
    }